

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeMaxObj(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int i,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *newVal,bool scale)

{
  uint *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined7 in_register_00000009;
  pointer pnVar5;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  int local_28;
  bool local_24;
  undefined8 local_20;
  
  if ((int)CONCAT71(in_register_00000009,scale) == 0) {
    pnVar5 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar5[i].m_backend.data._M_elems + 8) =
         *(undefined8 *)((newVal->m_backend).data._M_elems + 8);
    uVar2 = *(undefined8 *)(newVal->m_backend).data._M_elems;
    uVar3 = *(undefined8 *)((newVal->m_backend).data._M_elems + 2);
    uVar4 = *(undefined8 *)((newVal->m_backend).data._M_elems + 6);
    puVar1 = pnVar5[i].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar1 = *(undefined8 *)((newVal->m_backend).data._M_elems + 4);
    *(undefined8 *)(puVar1 + 2) = uVar4;
    *(undefined8 *)&pnVar5[i].m_backend.data = uVar2;
    *(undefined8 *)(pnVar5[i].m_backend.data._M_elems + 2) = uVar3;
    pnVar5[i].m_backend.exp = (newVal->m_backend).exp;
    pnVar5[i].m_backend.neg = (newVal->m_backend).neg;
    local_20._0_4_ = (newVal->m_backend).fpclass;
    local_20._4_4_ = (newVal->m_backend).prec_elem;
  }
  else {
    (*this->lp_scaler->_vptr_SPxScaler[0x29])(&local_50,this->lp_scaler,this,i);
    pnVar5 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar5[i].m_backend.data._M_elems + 8) = local_30;
    puVar1 = pnVar5[i].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar1 = local_40;
    *(undefined8 *)(puVar1 + 2) = uStack_38;
    *(undefined8 *)&pnVar5[i].m_backend.data = local_50;
    *(undefined8 *)(pnVar5[i].m_backend.data._M_elems + 2) = uStack_48;
    pnVar5[i].m_backend.exp = local_28;
    pnVar5[i].m_backend.neg = local_24;
  }
  *(undefined8 *)&pnVar5[i].m_backend.fpclass = local_20;
  return;
}

Assistant:

virtual void changeMaxObj(int i, const R& newVal, bool scale = false)
   {
      if(scale)
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPColSetBase<R>::maxObj_w(i) = lp_scaler->scaleObj(*this, i, newVal);
      }
      else
         LPColSetBase<R>::maxObj_w(i) = newVal;

      assert(isConsistent());
   }